

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O1

int __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
::remove(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>::DLPSV>
         *this,char *__filename)

{
  uint uVar1;
  Item *pIVar2;
  DataKey *pDVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  iVar5 = this->thenum;
  if (iVar5 < 1) {
    uVar4 = 0xffffffff;
  }
  else {
    pIVar2 = this->theitem;
    pDVar3 = this->thekey;
    uVar6 = 0;
    uVar4 = 0xffffffff;
    iVar7 = 0;
    do {
      if (*(int *)(__filename + uVar6 * 4) < 0) {
        uVar1 = pDVar3[uVar6].idx;
        pIVar2[(int)uVar1].info = this->firstfree;
        this->firstfree = ~uVar1;
        if ((int)uVar4 < 0) {
          uVar4 = uVar6 & 0xffffffff;
        }
      }
      else {
        *(int *)(__filename + uVar6 * 4) = iVar7;
        iVar7 = iVar7 + 1;
      }
      uVar6 = uVar6 + 1;
      iVar5 = this->thenum;
    } while ((long)uVar6 < (long)iVar5);
  }
  if ((int)uVar4 < iVar5 && -1 < (int)uVar4) {
    do {
      if ((long)*(int *)(__filename + uVar4 * 4) < 0) {
        this->thenum = this->thenum + -1;
      }
      else {
        this->thekey[*(int *)(__filename + uVar4 * 4)] = this->thekey[uVar4];
        pDVar3 = this->thekey;
        this->theitem[pDVar3[uVar4].idx].info = *(int *)(__filename + uVar4 * 4);
        pDVar3[uVar4].idx = -1;
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iVar5);
  }
  return (int)uVar4;
}

Assistant:

int num() const
   {
      return thenum;
   }